

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int bitstream_w_memcpy(bitstream_w *stream,void *src,size_t bytes)

{
  ulong uVar1;
  uint8_t *buffer;
  size_t offset;
  size_t bytes_local;
  void *src_local;
  bitstream_w *stream_local;
  
  bitstream_w_pad(stream);
  uVar1 = stream->bit_offset >> 3;
  if (stream->length < uVar1 + bytes) {
    stream_local._4_4_ = -1;
  }
  else {
    memcpy((void *)((long)stream->ptr + uVar1),src,bytes);
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int
bitstream_w_memcpy(struct bitstream_w *stream, const void *src, size_t bytes) {
  size_t offset;
  uint8_t *buffer;

  bitstream_w_pad(stream);
  offset = stream->bit_offset / 8;

  if (offset + bytes > stream->length) {
    return -1;
  }

  buffer = stream->ptr;

  memcpy(&buffer[offset], src, bytes);
  offset += bytes * 8;
  return 0;
}